

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
::int_writer<unsigned_long,_fmt::v5::basic_format_specs<char>_>::on_oct
          (int_writer<unsigned_long,_fmt::v5::basic_format_specs<char>_> *this)

{
  uint uVar1;
  basic_format_specs<char> *spec;
  bin_writer<3> f;
  int num_digits;
  string_view prefix;
  undefined4 uStack_c;
  
  num_digits = basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
               ::int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::count_digits<3u>(this)
  ;
  spec = this->spec;
  if ((((spec->super_core_format_specs).flags & 8) != 0) &&
     ((spec->super_core_format_specs).precision <= num_digits)) {
    uVar1 = this->prefix_size;
    this->prefix_size = uVar1 + 1;
    this->prefix[uVar1] = '0';
  }
  f._12_4_ = uStack_c;
  f.num_digits = num_digits;
  f.abs_value = this->abs_value;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.data_ = this->prefix;
  prefix.size_._4_4_ = 0;
  basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
  ::
  write_int<fmt::v5::basic_format_specs<char>,fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>::int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::bin_writer<3>>
            ((basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
              *)this->writer,num_digits,prefix,spec,f);
  return;
}

Assistant:

void on_oct() {
      int num_digits = count_digits<3>();
      if (spec.has(HASH_FLAG) &&
          spec.precision <= num_digits) {
        // Octal prefix '0' is counted as a digit, so only add it if precision
        // is not greater than the number of digits.
        prefix[prefix_size++] = '0';
      }
      writer.write_int(num_digits, get_prefix(), spec,
                       bin_writer<3>{abs_value, num_digits});
    }